

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O0

void __thiscall icu_63::anon_unknown_4::SortKeyLevel::appendWeight16(SortKeyLevel *this,uint32_t w)

{
  int iVar1;
  uchar uVar2;
  UBool UVar3;
  int iVar4;
  int32_t iVar5;
  uchar *puVar6;
  int32_t appendLength;
  uint8_t b1;
  uint8_t b0;
  uint32_t w_local;
  SortKeyLevel *this_local;
  
  uVar2 = (uchar)w;
  iVar4 = 2;
  if (uVar2 == '\0') {
    iVar4 = 1;
  }
  iVar1 = this->len;
  iVar5 = MaybeStackArray<unsigned_char,_40>::getCapacity(&this->buffer);
  if ((iVar1 + iVar4 <= iVar5) || (UVar3 = ensureCapacity(this,iVar4), UVar3 != '\0')) {
    iVar4 = this->len;
    this->len = iVar4 + 1;
    puVar6 = MaybeStackArray<unsigned_char,_40>::operator[](&this->buffer,(long)iVar4);
    *puVar6 = (uchar)(w >> 8);
    if (uVar2 != '\0') {
      iVar4 = this->len;
      this->len = iVar4 + 1;
      puVar6 = MaybeStackArray<unsigned_char,_40>::operator[](&this->buffer,(long)iVar4);
      *puVar6 = uVar2;
    }
  }
  return;
}

Assistant:

void
SortKeyLevel::appendWeight16(uint32_t w) {
    U_ASSERT((w & 0xffff) != 0);
    uint8_t b0 = (uint8_t)(w >> 8);
    uint8_t b1 = (uint8_t)w;
    int32_t appendLength = (b1 == 0) ? 1 : 2;
    if((len + appendLength) <= buffer.getCapacity() || ensureCapacity(appendLength)) {
        buffer[len++] = b0;
        if(b1 != 0) {
            buffer[len++] = b1;
        }
    }
}